

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.hpp
# Opt level: O2

unique_ptr<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridWavelet>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridWavelet> *this,AccelerationContext *acc,istream *is)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  GridWavelet *this_00;
  int in_R8D;
  MultiIndexSet local_40;
  AccelerationContext *local_18;
  
  local_18 = acc;
  Utils::make_unique<TasGrid::GridWavelet,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_18);
  iVar3 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x10) = iVar3;
  iVar3 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x14) = iVar3;
  iVar3 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  lVar1 = *(long *)this;
  *(int *)(lVar1 + 0xd0) = iVar3;
  RuleWavelet::updateOrder((RuleWavelet *)(lVar1 + 0x90),iVar3);
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_40,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x18),&local_40);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_40.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_40,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x40),&local_40);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_40.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar2) {
    IO::readData2D<TasGrid::IO::mode_binary_type,double,int,int>
              ((Data2D<double> *)&local_40,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x14),*(int *)(*(long *)this + 0x20),
               in_R8D);
    Data2D<double>::operator=((Data2D<double> *)(*(long *)this + 0xd8),(Data2D<double> *)&local_40);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40.indexes);
  }
  this_00 = *(GridWavelet **)this;
  if (0 < (this_00->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_40,is);
    StorageSet::operator=((StorageSet *)(*(long *)this + 0x68),(StorageSet *)&local_40);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40.indexes);
    this_00 = *(GridWavelet **)this;
  }
  GridWavelet::buildInterpolationMatrix(this_00);
  return (__uniq_ptr_data<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridWavelet> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridWavelet> grid = Utils::make_unique<GridWavelet>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->order = IO::readNumber<iomode, int>(is);
        grid->rule1D.updateOrder(grid->order);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
            if (IO::readFlag<iomode>(is))
                grid->coefficients = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
        }else{
            if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->coefficients = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
        }

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());
        grid->buildInterpolationMatrix();

        return grid;
    }